

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

void __thiscall
slang::ast::addSubroutineDrivers
          (ast *this,Symbol *procedure,SubroutineSymbol *sub,SourceRange range)

{
  SourceRange range_00;
  Statement *this_00;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>::templated_iterator<const_slang::ast::SubroutineSymbol_*>,_bool>
  pVar1;
  undefined1 local_198 [8];
  DriverVisitor visitor;
  key_type local_a0;
  undefined1 local_98 [8];
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
  visitedSubs;
  SubroutineSymbol *sub_local;
  Symbol *procedure_local;
  SourceRange range_local;
  
  visitedSubs.
  super_flat_hash_set<const_slang::ast::SubroutineSymbol_*,_std::hash<const_SubroutineSymbol_*>,_std::equal_to<const_SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
  .
  super_sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
  .num_elements = (size_t)procedure;
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
  ::SmallSet((SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
              *)local_98);
  local_a0 = (key_type)
             visitedSubs.
             super_flat_hash_set<const_slang::ast::SubroutineSymbol_*,_std::hash<const_SubroutineSymbol_*>,_std::equal_to<const_SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
             .
             super_sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
             .num_elements;
  pVar1 = ska::
          flat_hash_set<const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
          ::emplace((flat_hash_set<const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
                     *)&visitedSubs.
                        super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>
                        .ptr,&local_a0);
  visitor.visitedSubs =
       (SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
        *)pVar1.first.current;
  range_00.endLoc = range.startLoc;
  range_00.startLoc = (SourceLocation)sub;
  DriverVisitor::DriverVisitor
            ((DriverVisitor *)local_198,(Symbol *)this,
             (SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
              *)local_98,
             (SubroutineSymbol *)
             visitedSubs.
             super_flat_hash_set<const_slang::ast::SubroutineSymbol_*,_std::hash<const_SubroutineSymbol_*>,_std::equal_to<const_SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
             .
             super_sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
             .num_elements,range_00);
  this_00 = SubroutineSymbol::getBody
                      ((SubroutineSymbol *)
                       visitedSubs.
                       super_flat_hash_set<const_slang::ast::SubroutineSymbol_*,_std::hash<const_SubroutineSymbol_*>,_std::equal_to<const_SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
                       .
                       super_sherwood_v3_table<const_slang::ast::SubroutineSymbol_*,_const_slang::ast::SubroutineSymbol_*,_std::hash<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::SubroutineSymbol_*>_>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::SubroutineSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
                       .num_elements);
  Statement::visit<slang::ast::DriverVisitor&>(this_00,(DriverVisitor *)local_198);
  DriverVisitor::~DriverVisitor((DriverVisitor *)local_198);
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
  ::~SmallSet((SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::SubroutineSymbol_*>,_4UL>_>
               *)local_98);
  return;
}

Assistant:

static void addSubroutineDrivers(const Symbol& procedure, const SubroutineSymbol& sub,
                                 SourceRange range) {
    SmallSet<const SubroutineSymbol*, 4> visitedSubs;
    visitedSubs.emplace(&sub);

    DriverVisitor visitor(procedure, visitedSubs, sub, range);
    sub.getBody().visit(visitor);
}